

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexWrapper.hpp
# Opt level: O0

IndexWrapper<unsigned_char,_Diligent::_DeviceContextIndexTag> * __thiscall
Diligent::IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag>::operator=
          (IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag> *this,uchar *Value)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  uchar *Value_local;
  IndexWrapper<unsigned_char,_Diligent::_DeviceContextIndexTag> *this_local;
  
  *this = (IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag>)*Value;
  if (*this != (IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag>)*Value) {
    msg.field_2._8_8_ = Value;
    FormatString<char[32],unsigned_char>
              ((string *)local_38,(Diligent *)"Not enough bits to store value ",(char (*) [32])Value
               ,(uchar *)(ulong)*Value);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"operator=",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/IndexWrapper.hpp"
               ,0x46);
    std::__cxx11::string::~string((string *)local_38);
  }
  return (IndexWrapper<unsigned_char,_Diligent::_DeviceContextIndexTag> *)this;
}

Assistant:

IndexWrapper& operator=(const T& Value)
    {
        m_Value = static_cast<IndexType>(Value);
        VERIFY(static_cast<T>(m_Value) == Value, "Not enough bits to store value ", Value);
        return *this;
    }